

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

__pid_t __thiscall
kj::Promise<kj::Array<unsigned_char>_>::wait
          (Promise<kj::Array<unsigned_char>_> *this,void *__stat_loc)

{
  WaitScope *in_RDX;
  ExceptionOr<kj::Array<unsigned_char>_> result;
  ExceptionOr<kj::Array<unsigned_char>_> local_188;
  
  local_188.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_188.value.ptr.isSet = false;
  _::waitImpl((Own<kj::_::PromiseNode> *)__stat_loc,&local_188.super_ExceptionOrValue,in_RDX);
  if (local_188.value.ptr.isSet == true) {
    if (local_188.super_ExceptionOrValue.exception.ptr.isSet != false) {
      throwRecoverableException(&local_188.super_ExceptionOrValue.exception.ptr.field_1.value,0);
    }
    (this->super_PromiseBase).node.disposer = (Disposer *)local_188.value.ptr.field_1.value.ptr;
    (this->super_PromiseBase).node.ptr = (PromiseNode *)local_188.value.ptr.field_1.value.size_;
    this[1].super_PromiseBase.node.disposer = (Disposer *)local_188.value.ptr.field_1.value.disposer
    ;
    local_188.value.ptr.field_1.value.ptr = (uchar *)0x0;
    local_188.value.ptr.field_1.value.size_ = 0;
    _::ExceptionOr<kj::Array<unsigned_char>_>::~ExceptionOr(&local_188);
    return (__pid_t)this;
  }
  if (local_188.super_ExceptionOrValue.exception.ptr.isSet != false) {
    throwFatalException(&local_188.super_ExceptionOrValue.exception.ptr.field_1.value,0);
  }
  _::unreachable();
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope) {
  _::ExceptionOr<_::FixVoid<T>> result;

  _::waitImpl(kj::mv(node), result, waitScope);

  KJ_IF_MAYBE(value, result.value) {
    KJ_IF_MAYBE(exception, result.exception) {
      throwRecoverableException(kj::mv(*exception));
    }
    return _::returnMaybeVoid(kj::mv(*value));
  } else KJ_IF_MAYBE(exception, result.exception) {
    throwFatalException(kj::mv(*exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }